

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O0

int parse_DA_values(char *inArg,uint *DA_x0,uint *DA_y0,uint *DA_x1,uint *DA_y1)

{
  uint uVar1;
  char *local_68;
  char *result;
  uint local_58;
  uint uStack_54;
  char delims [2];
  int values [4];
  int local_3c;
  int it;
  uint *DA_y1_local;
  uint *DA_x1_local;
  uint *DA_y0_local;
  uint *DA_x0_local;
  char *inArg_local;
  
  local_3c = 0;
  result._6_2_ = 0x2c;
  local_68 = strtok(inArg,(char *)((long)&result + 6));
  for (; local_68 != (char *)0x0 && local_3c < 4; local_3c = local_3c + 1) {
    uVar1 = atoi(local_68);
    (&local_58)[local_3c] = uVar1;
    local_68 = strtok((char *)0x0,(char *)((long)&result + 6));
  }
  if (local_3c == 4) {
    *DA_x0 = local_58;
    *DA_y0 = uStack_54;
    *DA_x1 = values[0];
    *DA_y1 = values[1];
  }
  inArg_local._4_4_ = (uint)(local_3c != 4);
  return inArg_local._4_4_;
}

Assistant:

int parse_DA_values(char* inArg, unsigned int *DA_x0, unsigned int *DA_y0,
                    unsigned int *DA_x1, unsigned int *DA_y1)
{
    int it = 0;
    int values[4];
    char delims[] = ",";
    char *result = NULL;
    result = strtok(inArg, delims);

    while ((result != NULL) && (it < 4)) {
        values[it] = atoi(result);
        result = strtok(NULL, delims);
        it++;
    }

    if (it != 4) {
        return EXIT_FAILURE;
    } else {
        *DA_x0 = (OPJ_UINT32)values[0];
        *DA_y0 = (OPJ_UINT32)values[1];
        *DA_x1 = (OPJ_UINT32)values[2];
        *DA_y1 = (OPJ_UINT32)values[3];
        return EXIT_SUCCESS;
    }
}